

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O0

double acosd(double v)

{
  double in_XMM0_Qa;
  double dVar1;
  
  if (in_XMM0_Qa < 1.0) {
    if ((in_XMM0_Qa == 0.0) && (!NAN(in_XMM0_Qa))) {
      return 90.0;
    }
    if ((in_XMM0_Qa <= -1.0) && (-1e-10 < in_XMM0_Qa + 1.0)) {
      return 180.0;
    }
  }
  else if (in_XMM0_Qa - 1.0 < 1e-10) {
    return 0.0;
  }
  dVar1 = acos(in_XMM0_Qa);
  return dVar1 * 57.29577951308232;
}

Assistant:

double acosd(double v) {
    if (v >= 1.0) {
        if (v - 1.0 < TRIG_TOL)
            return 0.0;
    } else if (v == 0.0) {
        return 90.0;
    } else if (v <= -1.0) {
        if (v + 1.0 > -TRIG_TOL)
            return 180.0;
    }

    return acos(v) * R2D;
}